

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Value * json_object_dotget_value(JSON_Object *object,char *name)

{
  JSON_Value *pJVar1;
  JSON_Object *in_RSI;
  char *unaff_retaddr;
  char *dot_position;
  size_t in_stack_fffffffffffffff8;
  
  pJVar1 = (JSON_Value *)strchr((char *)in_RSI,0x2e);
  if (pJVar1 == (JSON_Value *)0x0) {
    pJVar1 = json_object_get_value(in_RSI,(char *)0x0);
  }
  else {
    json_object_getn_value((JSON_Object *)dot_position,unaff_retaddr,in_stack_fffffffffffffff8);
    json_value_get_object(pJVar1);
    pJVar1 = json_object_dotget_value(in_RSI,(char *)pJVar1);
  }
  return pJVar1;
}

Assistant:

JSON_Value * json_object_dotget_value(const JSON_Object *object, const char *name) {
    const char *dot_position = strchr(name, '.');
    if (!dot_position) {
        return json_object_get_value(object, name);
    }
    object = json_value_get_object(json_object_getn_value(object, name, dot_position - name));
    return json_object_dotget_value(object, dot_position + 1);
}